

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O0

bool CEditor::PopupEvent(void *pContext,CUIRect View)

{
  long lVar1;
  int iVar2;
  CConfig *pCVar3;
  CEditor *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  CEditor *pEditor;
  CUIRect ButtonBar;
  CUIRect Label;
  CUIRect *in_stack_ffffffffffffff88;
  CUIRect *pLeft;
  CEditor *in_stack_ffffffffffffff90;
  CUIRect *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  CEditor *pRect;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  bool bVar4;
  CEditor *in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  char *pToolTip;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pToolTip = (char *)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  pRect = in_RDI;
  CUIRect::HSplitTop(in_stack_ffffffffffffff98,(float)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                     in_stack_ffffffffffffff88,(CUIRect *)0x21500a);
  CUIRect::HSplitTop(in_stack_ffffffffffffff98,(float)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                     in_stack_ffffffffffffff88,(CUIRect *)0x215024);
  if (in_RDI->m_PopupEventType == 0) {
    UI(in_RDI);
    CUI::DoLabel((CUI *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                 (CUIRect *)pRect,(char *)in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8
                 ,in_stack_ffffffffffffffa4,SUB41((uint)in_stack_ffffffffffffffa0 >> 0x18,0));
  }
  else if (in_RDI->m_PopupEventType == 1) {
    UI(in_RDI);
    CUI::DoLabel((CUI *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                 (CUIRect *)pRect,(char *)in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8
                 ,in_stack_ffffffffffffffa4,SUB41((uint)in_stack_ffffffffffffffa0 >> 0x18,0));
  }
  else if (in_RDI->m_PopupEventType == 2) {
    UI(in_RDI);
    CUI::DoLabel((CUI *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                 (CUIRect *)pRect,(char *)in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8
                 ,in_stack_ffffffffffffffa4,SUB41((uint)in_stack_ffffffffffffffa0 >> 0x18,0));
  }
  else if (in_RDI->m_PopupEventType == 3) {
    UI(in_RDI);
    CUI::DoLabel((CUI *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                 (CUIRect *)pRect,(char *)in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8
                 ,in_stack_ffffffffffffffa4,SUB41((uint)in_stack_ffffffffffffffa0 >> 0x18,0));
  }
  else if (in_RDI->m_PopupEventType == 4) {
    UI(in_RDI);
    CUI::DoLabel((CUI *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                 (CUIRect *)pRect,(char *)in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8
                 ,in_stack_ffffffffffffffa4,SUB41((uint)in_stack_ffffffffffffffa0 >> 0x18,0));
  }
  CUIRect::HSplitBottom
            (in_stack_ffffffffffffff98,(float)((ulong)in_stack_ffffffffffffff90 >> 0x20),
             in_stack_ffffffffffffff88,(CUIRect *)0x2151af);
  CUIRect::HSplitBottom
            (in_stack_ffffffffffffff98,(float)((ulong)in_stack_ffffffffffffff90 >> 0x20),
             in_stack_ffffffffffffff88,(CUIRect *)0x2151c9);
  CUIRect::HSplitTop(in_stack_ffffffffffffff98,(float)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                     in_stack_ffffffffffffff88,(CUIRect *)0x2151e2);
  CUIRect::VMargin(in_stack_ffffffffffffff98,(float)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                   in_stack_ffffffffffffff88);
  CUIRect::HSplitTop(in_stack_ffffffffffffff98,(float)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                     in_stack_ffffffffffffff88,(CUIRect *)0x215211);
  if (in_RDI->m_PopupEventType == 0) {
    UI(in_RDI);
    CUI::DoLabel((CUI *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                 (CUIRect *)pRect,(char *)in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8
                 ,in_stack_ffffffffffffffa4,SUB41((uint)in_stack_ffffffffffffffa0 >> 0x18,0));
  }
  else if (in_RDI->m_PopupEventType == 1) {
    UI(in_RDI);
    CUI::DoLabel((CUI *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                 (CUIRect *)pRect,(char *)in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8
                 ,in_stack_ffffffffffffffa4,SUB41((uint)in_stack_ffffffffffffffa0 >> 0x18,0));
  }
  else if (in_RDI->m_PopupEventType == 2) {
    UI(in_RDI);
    CUI::DoLabel((CUI *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                 (CUIRect *)pRect,(char *)in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8
                 ,in_stack_ffffffffffffffa4,SUB41((uint)in_stack_ffffffffffffffa0 >> 0x18,0));
  }
  else if (in_RDI->m_PopupEventType == 3) {
    UI(in_RDI);
    CUI::DoLabel((CUI *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                 (CUIRect *)pRect,(char *)in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8
                 ,in_stack_ffffffffffffffa4,SUB41((uint)in_stack_ffffffffffffffa0 >> 0x18,0));
  }
  else if (in_RDI->m_PopupEventType == 4) {
    UI(in_RDI);
    CUI::DoLabel((CUI *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                 (CUIRect *)pRect,(char *)in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8
                 ,in_stack_ffffffffffffffa4,SUB41((uint)in_stack_ffffffffffffffa0 >> 0x18,0));
  }
  CUIRect::VSplitLeft(in_stack_ffffffffffffff98,(float)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                      in_stack_ffffffffffffff88,(CUIRect *)0x2153bf);
  CUIRect::VSplitLeft(in_stack_ffffffffffffff98,(float)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                      in_stack_ffffffffffffff88,(CUIRect *)0x2153d9);
  pLeft = (CUIRect *)0x0;
  iVar2 = DoButton_Editor(in_stack_ffffffffffffffc8,
                          (void *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                          (char *)pRect,(int)((ulong)in_RDI >> 0x20),
                          (CUIRect *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          (int)in_stack_ffffffffffffffa4,pToolTip);
  if (iVar2 == 0) {
    CUIRect::VSplitRight
              (in_stack_ffffffffffffff98,(float)((ulong)in_stack_ffffffffffffff90 >> 0x20),pLeft,
               (CUIRect *)0x215532);
    CUIRect::VSplitRight
              (in_stack_ffffffffffffff98,(float)((ulong)in_stack_ffffffffffffff90 >> 0x20),pLeft,
               (CUIRect *)0x21554c);
    iVar2 = DoButton_Editor(in_stack_ffffffffffffffc8,
                            (void *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                            (char *)pRect,(int)((ulong)in_RDI >> 0x20),
                            (CUIRect *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                            ,(int)in_stack_ffffffffffffffa4,pToolTip);
    if (iVar2 == 0) {
      bVar4 = false;
    }
    else {
      in_RDI->m_PopupEventWasActivated = 0;
      bVar4 = true;
    }
  }
  else {
    if (in_RDI->m_PopupEventType == 0) {
      pCVar3 = Config(in_RDI);
      pCVar3->m_ClEditor = 0;
    }
    else if (in_RDI->m_PopupEventType == 1) {
      InvokeFileDialog(in_RDI,(int)in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                       (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       (char *)in_RDI,(char *)CallbackOpenMap,
                       (char *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                       (_func_void_char_ptr_int_void_ptr *)in_stack_ffffffffffffffc8,
                       in_stack_ffffffffffffffd0);
    }
    else if (in_RDI->m_PopupEventType == 2) {
      LoadCurrentMap(in_stack_ffffffffffffff90);
    }
    else if (in_RDI->m_PopupEventType == 3) {
      Reset(in_stack_ffffffffffffff90,SUB81((ulong)pLeft >> 0x38,0));
      in_RDI->m_aFileName[0] = '\0';
    }
    else if (in_RDI->m_PopupEventType == 4) {
      CallbackSaveMap((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (int)in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
    }
    in_RDI->m_PopupEventWasActivated = 0;
    bVar4 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool CEditor::PopupEvent(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CUIRect Label, ButtonBar;

	// title
	View.HSplitTop(10.0f, 0, &View);
	View.HSplitTop(30.0f, &Label, &View);
	if(pEditor->m_PopupEventType == POPEVENT_EXIT)
		pEditor->UI()->DoLabel(&Label, "Exit the editor", 20.0f, TEXTALIGN_CENTER);
	else if(pEditor->m_PopupEventType == POPEVENT_LOAD)
		pEditor->UI()->DoLabel(&Label, "Load map", 20.0f, TEXTALIGN_CENTER);
	else if(pEditor->m_PopupEventType == POPEVENT_LOAD_CURRENT)
		pEditor->UI()->DoLabel(&Label, "Load current map", 20.0f, TEXTALIGN_CENTER);
	else if(pEditor->m_PopupEventType == POPEVENT_NEW)
		pEditor->UI()->DoLabel(&Label, "New map", 20.0f, TEXTALIGN_CENTER);
	else if(pEditor->m_PopupEventType == POPEVENT_SAVE)
		pEditor->UI()->DoLabel(&Label, "Save map", 20.0f, TEXTALIGN_CENTER);

	View.HSplitBottom(10.0f, &View, 0);
	View.HSplitBottom(20.0f, &View, &ButtonBar);

	// notification text
	View.HSplitTop(30.0f, 0, &View);
	View.VMargin(40.0f, &View);
	View.HSplitTop(20.0f, &Label, &View);
	if(pEditor->m_PopupEventType == POPEVENT_EXIT)
		pEditor->UI()->DoLabel(&Label, "The map contains unsaved data, you might want to save it before you exit the editor.\nContinue anyway?", 10.0f, TEXTALIGN_LEFT, Label.w-10.0f);
	else if(pEditor->m_PopupEventType == POPEVENT_LOAD)
		pEditor->UI()->DoLabel(&Label, "The map contains unsaved data, you might want to save it before you load a new map.\nContinue anyway?", 10.0f, TEXTALIGN_LEFT, Label.w-10.0f);
	else if(pEditor->m_PopupEventType == POPEVENT_LOAD_CURRENT)
		pEditor->UI()->DoLabel(&Label, "The map contains unsaved data, you might want to save it before you load the current map.\nContinue anyway?", 10.0f, TEXTALIGN_LEFT, Label.w-10.0f);
	else if(pEditor->m_PopupEventType == POPEVENT_NEW)
		pEditor->UI()->DoLabel(&Label, "The map contains unsaved data, you might want to save it before you create a new map.\nContinue anyway?", 10.0f, TEXTALIGN_LEFT, Label.w-10.0f);
	else if(pEditor->m_PopupEventType == POPEVENT_SAVE)
		pEditor->UI()->DoLabel(&Label, "The file already exists.\nDo you want to overwrite the map?", 10.0f, TEXTALIGN_LEFT);

	// button bar
	ButtonBar.VSplitLeft(30.0f, 0, &ButtonBar);
	ButtonBar.VSplitLeft(110.0f, &Label, &ButtonBar);
	static int s_OkButton = 0;
	if(pEditor->DoButton_Editor(&s_OkButton, "Ok", 0, &Label, 0, 0))
	{
		if(pEditor->m_PopupEventType == POPEVENT_EXIT)
			pEditor->Config()->m_ClEditor = 0;
		else if(pEditor->m_PopupEventType == POPEVENT_LOAD)
			pEditor->InvokeFileDialog(IStorage::TYPE_ALL, FILETYPE_MAP, "Load map", "Load", "maps", "", pEditor->CallbackOpenMap, pEditor);
		else if(pEditor->m_PopupEventType == POPEVENT_LOAD_CURRENT)
			pEditor->LoadCurrentMap();
		else if(pEditor->m_PopupEventType == POPEVENT_NEW)
		{
			pEditor->Reset();
			pEditor->m_aFileName[0] = 0;
		}
		else if(pEditor->m_PopupEventType == POPEVENT_SAVE)
			pEditor->CallbackSaveMap(pEditor->m_aFileSaveName, IStorage::TYPE_SAVE, pEditor);
		pEditor->m_PopupEventWasActivated = false;
		return true;
	}
	ButtonBar.VSplitRight(30.0f, &ButtonBar, 0);
	ButtonBar.VSplitRight(110.0f, &ButtonBar, &Label);
	static int s_AbortButton = 0;
	if(pEditor->DoButton_Editor(&s_AbortButton, "Abort", 0, &Label, 0, 0))
	{
		pEditor->m_PopupEventWasActivated = false;
		return true;
	}

	return false;
}